

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool __thiscall ON_wString::ContainsNoCase(ON_wString *this,wchar_t *wszSub)

{
  wchar_t *pwVar1;
  wchar_t *__needle;
  ON_wString local_40;
  ON_wString s2;
  ON_wString local_28;
  ON_wString s1;
  wchar_t *wszSub_local;
  ON_wString *this_local;
  
  s1.m_s = wszSub;
  ON_wString(&local_28,this);
  MakeLowerOrdinal(&local_28);
  ON_wString(&local_40,s1.m_s);
  MakeLowerOrdinal(&local_40);
  pwVar1 = operator_cast_to_wchar_t_(&local_28);
  __needle = operator_cast_to_wchar_t_(&local_40);
  pwVar1 = wcsstr(pwVar1,__needle);
  ~ON_wString(&local_40);
  ~ON_wString(&local_28);
  return pwVar1 != (wchar_t *)0x0;
}

Assistant:

bool ON_wString::ContainsNoCase(const wchar_t* wszSub) const
{
  ON_wString s1 = *this;
  s1.MakeLowerOrdinal();
  ON_wString s2 = wszSub;
  s2.MakeLowerOrdinal();
  if (nullptr != wcsstr(s1, s2))
    return true;

  return false;
}